

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::CreateRotationMesh(TPZMHMixedMeshControl *this)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  TPZCompMesh *pTVar4;
  TPZCompEl **ppTVar5;
  TPZCompElDisc *this_00;
  TPZGeoEl *pTVar6;
  TPZConnect *this_01;
  TPZMHMeshControl *this_02;
  TPZVec<long> *this_03;
  int64_t index;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  TPZGeoEl *gel;
  TPZCompEl *cel_1;
  int64_t el;
  int64_t ic;
  int64_t nc;
  TPZCompElDisc *celdisc;
  TPZCompEl *cel;
  int64_t i;
  int64_t nel;
  TPZMaterial *mat;
  int it;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  int meshdim;
  TPZCompMesh *cmeshRotation;
  int porder;
  TPZGeoMesh *gmesh;
  size_t in_stack_00000218;
  char *in_stack_00000220;
  string *in_stack_fffffffffffffdf8;
  TPZCompMesh *in_stack_fffffffffffffe00;
  TPZMHMeshControl *in_stack_fffffffffffffe08;
  TPZGeoMesh *in_stack_fffffffffffffe10;
  value_type_conflict4 *in_stack_fffffffffffffe18;
  TPZCompMesh *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  _Self local_120;
  int local_114;
  _Self local_110;
  TPZGeoEl *local_108;
  TPZMHMeshControl *local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  TPZCompElDisc *local_e0;
  TPZCompEl *local_d8;
  long local_d0;
  long local_c8;
  _Base_ptr local_c0;
  undefined1 local_b8;
  TPZMaterial *local_b0;
  int local_a4;
  _Self local_a0;
  _Self local_98;
  long local_90;
  undefined1 local_88 [48];
  int local_58;
  allocator<char> local_41;
  string local_40 [32];
  TPZCompMesh *local_20;
  int local_14;
  TPZGeoMesh *local_10;
  
  local_10 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference(in_stack_fffffffffffffe10);
  local_14 = *(int *)(in_RDI + 0xb0);
  local_20 = TPZAutoPointer<TPZCompMesh>::operator->
                       ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1f0));
  TPZGeoMesh::ResetReference(in_stack_fffffffffffffe10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  TPZCompMesh::SetName(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pTVar4 = local_20;
  iVar2 = TPZGeoMesh::Dimension(local_10);
  TPZCompMesh::SetDimModel(pTVar4,iVar2);
  TPZCompMesh::ApproxSpace(local_20);
  TPZCreateApproximationSpace::SetAllCreateFunctionsDiscontinuous
            ((TPZCreateApproximationSpace *)in_stack_fffffffffffffe00);
  TPZCompMesh::SetDefaultOrder(local_20,local_14);
  local_58 = TPZCompMesh::Dimension(local_20);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f5fb1d);
  local_90 = in_RDI + 0x50;
  local_98._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
  local_a0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
  while (bVar1 = std::operator!=(&local_98,&local_a0), bVar1) {
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1f5fb86)
    ;
    local_a4 = *piVar3;
    local_b0 = TPZCompMesh::FindMaterial
                         (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20))
    ;
    if ((local_b0 != (TPZMaterial *)0x0) &&
       (iVar2 = (**(code **)(*(long *)local_b0 + 0x50))(), iVar2 == local_58)) {
      pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffe20
                         ,in_stack_fffffffffffffe18);
      local_c0 = (_Base_ptr)pVar7.first._M_node;
      local_b8 = pVar7.second;
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe00);
  }
  (**(code **)(*(long *)local_20 + 0xf8))(local_20,local_88);
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1f0));
  (**(code **)(*(long *)pTVar4 + 0x60))();
  local_c8 = TPZCompMesh::NElements((TPZCompMesh *)0x1f5fd1f);
  for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
    TPZCompMesh::ElementVec(local_20);
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_fffffffffffffe20,
                         (int64_t)in_stack_fffffffffffffe18);
    local_d8 = *ppTVar5;
    if (local_d8 == (TPZCompEl *)0x0) {
      this_00 = (TPZCompElDisc *)0x0;
    }
    else {
      this_00 = (TPZCompElDisc *)
                __dynamic_cast(local_d8,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
    }
    local_e0 = this_00;
    if (this_00 == (TPZCompElDisc *)0x0) {
      pzinternal::DebugStopImpl(in_stack_00000220,in_stack_00000218);
    }
    if (local_e0 != (TPZCompElDisc *)0x0) {
      pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe08);
      iVar2 = (**(code **)(*(long *)pTVar6 + 0x210))();
      if (iVar2 != local_58) {
        pzinternal::DebugStopImpl(in_stack_00000220,in_stack_00000218);
      }
    }
    TPZCompElDisc::SetTotalOrderShape((TPZCompElDisc *)in_stack_fffffffffffffe00);
    TPZCompElDisc::SetFalseUseQsiEta(this_00);
  }
  local_e8 = TPZCompMesh::NConnects((TPZCompMesh *)0x1f5feb4);
  for (local_f0 = 0; local_f0 < local_e8; local_f0 = local_f0 + 1) {
    TPZCompMesh::ConnectVec(local_20);
    this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffe20,
                         (int64_t)in_stack_fffffffffffffe18);
    TPZConnect::SetLagrangeMultiplier(this_01,'\x01');
  }
  TPZGeoMesh::ResetReference(in_stack_fffffffffffffe10);
  for (local_f8 = 0; local_f8 < local_c8; local_f8 = local_f8 + 1) {
    this_02 = (TPZMHMeshControl *)
              TPZCompMesh::Element(in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8);
    local_100 = this_02;
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe08);
    local_108 = pTVar6;
    iVar2 = TPZGeoEl::MaterialId(pTVar6);
    local_114 = iVar2;
    local_110._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffe08,
                    (key_type *)in_stack_fffffffffffffe00);
    local_120._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffdf8);
    bVar1 = std::operator==(&local_110,&local_120);
    if (!bVar1) {
      this_03 = (TPZVec<long> *)(in_RDI + 200);
      in_stack_fffffffffffffe08 = local_100;
      index = TPZGeoEl::Index(local_108);
      in_stack_fffffffffffffe00 = (TPZCompMesh *)TPZVec<long>::operator[](this_03,index);
      TPZMHMeshControl::SetSubdomain
                (this_02,(TPZCompEl *)pTVar6,CONCAT44(iVar2,in_stack_fffffffffffffe30));
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f600d0);
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateRotationMesh()
{
    TPZGeoMesh * gmesh = fGMesh.operator->();
    gmesh->ResetReference();
    int porder = fpOrderInternal;
    TPZCompMesh * cmeshRotation = fRotationMesh.operator->();
    gmesh->ResetReference();
    cmeshRotation->SetName("RotationMesh");
    cmeshRotation->SetDimModel(gmesh->Dimension());
    cmeshRotation->ApproxSpace().SetAllCreateFunctionsDiscontinuous();
    cmeshRotation->SetDefaultOrder(porder);
    
    int meshdim = cmeshRotation->Dimension();
    std::set<int> matids;
    for (auto it:fMaterialIds) {
        TPZMaterial *mat = cmeshRotation->FindMaterial(it);
        if (mat && mat->Dimension() == meshdim) {
            matids.insert(it);
        }
    }
    cmeshRotation->AutoBuild(matids);
    fRotationMesh->ExpandSolution();
    
    if(0)
    {
        std::ofstream out("RotationsMesh.txt");
        fPressureFineMesh->Print(out);
    }

    
    int64_t nel = cmeshRotation->NElements();
    for(int64_t i=0; i<nel; i++){
        TPZCompEl *cel = cmeshRotation->ElementVec()[i];
        TPZCompElDisc *celdisc = dynamic_cast<TPZCompElDisc *>(cel);
        if(!celdisc) DebugStop();
        if(celdisc && celdisc->Reference()->Dimension() != meshdim)
        {
            DebugStop();
        }
        celdisc->SetTotalOrderShape();
        celdisc->SetFalseUseQsiEta();
    }
    
    int64_t nc = cmeshRotation->NConnects();
    for (int64_t ic=0; ic<nc; ic++) {
        cmeshRotation->ConnectVec()[ic].SetLagrangeMultiplier(1);
    }
    gmesh->ResetReference();
    
    for (int64_t el=0; el<nel; el++)
    {
        TPZCompEl *cel = cmeshRotation->Element(el);
#ifdef PZDEBUG
        if (! cel) {
            DebugStop();
        }
#endif
        TPZGeoEl *gel = cel->Reference();
        if(fMaterialIds.find (gel->MaterialId()) == fMaterialIds.end())
        {
            continue;
        }
#ifdef PZDEBUG
        if (fGeoToMHMDomain[gel->Index()] == -1) {
            DebugStop();
        }
#endif
        
        SetSubdomain(cel, fGeoToMHMDomain[gel->Index()]);
    }
    
    
    return;
}